

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<MakefileGenerator::Compiler>::moveAppend
          (QGenericArrayOps<MakefileGenerator::Compiler> *this,Compiler *b,Compiler *e)

{
  qsizetype *pqVar1;
  Compiler *pCVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  uint uVar7;
  
  if ((b != e) && (b < e)) {
    pCVar2 = (this->super_QArrayDataPointer<MakefileGenerator::Compiler>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<MakefileGenerator::Compiler>).size;
      pDVar4 = (b->variable_in).d.d;
      (b->variable_in).d.d = (Data *)0x0;
      pCVar2[lVar3].variable_in.d.d = pDVar4;
      pcVar5 = (b->variable_in).d.ptr;
      (b->variable_in).d.ptr = (char16_t *)0x0;
      pCVar2[lVar3].variable_in.d.ptr = pcVar5;
      qVar6 = (b->variable_in).d.size;
      (b->variable_in).d.size = 0;
      pCVar2[lVar3].variable_in.d.size = qVar6;
      uVar7 = b->type;
      pCVar2[lVar3].flags = b->flags;
      pCVar2[lVar3].type = uVar7;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<MakefileGenerator::Compiler>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }